

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-common.c
# Opt level: O0

int linktype_to_dlt(int linktype)

{
  int local_14;
  int i;
  int linktype_local;
  
  if (linktype == 0xf6) {
    i = 0xf6;
  }
  else if (linktype == 0x102) {
    i = 0x102;
  }
  else {
    i = linktype;
    if ((linktype < 0x68) || (0x108 < linktype)) {
      local_14 = 0;
      while (map[local_14].linktype != -1) {
        if (map[local_14].linktype == linktype) {
          return map[local_14].dlt;
        }
        local_14 = local_14 + 1;
      }
    }
  }
  return i;
}

Assistant:

int
linktype_to_dlt(int linktype)
{
	int i;

	/*
	 * LINKTYPEs in the matching range that *don't*
	 * have the same value as the corresponding DLTs
	 * because, for some reason, not all OSes have the
	 * same value for that DLT.
	 */
	if (linktype == LINKTYPE_PFSYNC)
		return (DLT_PFSYNC);
	if (linktype == LINKTYPE_PKTAP)
		return (DLT_PKTAP);

	/*
	 * For all other values in the matching range, the LINKTYPE
	 * value is the same as the DLT value.
	 */
	if (linktype >= LINKTYPE_MATCHING_MIN &&
	    linktype <= LINKTYPE_MATCHING_MAX)
		return (linktype);

	/*
	 * Map the values outside that range.
	 */
	for (i = 0; map[i].linktype != -1; i++) {
		if (map[i].linktype == linktype)
			return (map[i].dlt);
	}

	/*
	 * If we don't have an entry for this LINKTYPE, return
	 * the link type value; it may be a DLT from an older
	 * version of libpcap.
	 */
	return linktype;
}